

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O0

void __thiscall
trng::lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U>::step
          (lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U> *this)

{
  uint mask_D;
  lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U> *this_local;
  
  (this->S).index = (this->S).index + 1;
  (this->S).index = (this->S).index & 0x7fff;
  (this->S).r[(this->S).index] =
       (this->S).r[(this->S).index - 0xf14 & 0x7fff] ^
       (this->S).r[(this->S).index - 0x1bab & 0x7fff] ^
       (this->S).r[(this->S).index - 0x2d3c & 0x7fff] ^
       (this->S).r[(this->S).index - 0x4de1 & 0x7fff];
  return;
}

Assistant:

void step() {
      constexpr auto mask_D{int_math::mask(static_cast<decltype(S.index)>(D))};
      ++S.index;
      S.index &= mask_D;
      S.r[S.index] = S.r[(S.index - A) & mask_D] ^ S.r[(S.index - B) & mask_D] ^
                     S.r[(S.index - C) & mask_D] ^ S.r[(S.index - D) & mask_D];
    }